

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintStats(Gia_Man_t *p,Gps_Par_t *pPars)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  float fVar11;
  double dVar12;
  char *local_70;
  float SwiTotal;
  int fHaveLevels;
  Gps_Par_t *pPars_local;
  Gia_Man_t *p_local;
  
  pVVar1 = p->vLevels;
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fMiter != 0)) {
    Gia_ManPrintStatsMiter(p,0);
    return;
  }
  if ((pPars == (Gps_Par_t *)0x0) || (pPars->fNoColor == 0)) {
    if (p->pName != (char *)0x0) {
      Abc_Print(1,"%s%-8s%s : ","\x1b[1;37m",p->pName,"\x1b[0m");
    }
  }
  else if (p->pName != (char *)0x0) {
    Abc_Print(1,"%-8s : ",p->pName);
  }
  iVar2 = Gia_ManPiNum(p);
  iVar3 = Gia_ManBoxCiNum(p);
  iVar4 = Gia_ManRegBoxNum(p);
  iVar5 = Gia_ManPoNum(p);
  iVar6 = Gia_ManBoxCoNum(p);
  iVar7 = Gia_ManRegBoxNum(p);
  Abc_Print(1,"i/o =%7d/%7d",(ulong)(uint)((iVar2 - iVar3) - iVar4),
            (ulong)(uint)((iVar5 - iVar6) - iVar7));
  iVar2 = Gia_ManConstrNum(p);
  if (iVar2 != 0) {
    uVar8 = Gia_ManConstrNum(p);
    Abc_Print(1,"(c=%d)",(ulong)uVar8);
  }
  iVar2 = Gia_ManRegNum(p);
  if (iVar2 != 0) {
    uVar8 = Gia_ManRegNum(p);
    Abc_Print(1,"  ff =%7d",(ulong)uVar8);
  }
  iVar2 = Gia_ManRegBoxNum(p);
  if (iVar2 != 0) {
    uVar8 = Gia_ManRegBoxNum(p);
    uVar9 = Gia_ManClockDomainNum(p);
    Abc_Print(1,"  boxff =%d(%d)",(ulong)uVar8,(ulong)uVar9);
  }
  if ((pPars == (Gps_Par_t *)0x0) || (pPars->fNoColor == 0)) {
    pcVar10 = "and";
    if (p->pMuxes != (uint *)0x0) {
      pcVar10 = "nod";
    }
    uVar8 = Gia_ManAndNum(p);
    Abc_Print(1,"  %s%s =%8d%s","\x1b[1;36m",pcVar10,(ulong)uVar8,"\x1b[0m");
    uVar8 = Gia_ManLevelNum(p);
    Abc_Print(1,"  %slev =%5d%s","\x1b[1;35m",(ulong)uVar8,"\x1b[0m");
    fVar11 = Gia_ManLevelAve(p);
    Abc_Print(1," %s(%.2f)%s",(double)fVar11,"\x1b[1;35m");
  }
  else {
    pcVar10 = "and";
    if (p->pMuxes != (uint *)0x0) {
      pcVar10 = "nod";
    }
    Gia_ManAndNum(p);
    Abc_Print(1,"  %s =%8d",pcVar10);
    uVar8 = Gia_ManLevelNum(p);
    Abc_Print(1,"  lev =%5d",(ulong)uVar8);
    fVar11 = Gia_ManLevelAve(p);
    Abc_Print(1," (%.2f)",(double)fVar11);
  }
  if (pVVar1 == (Vec_Int_t *)0x0) {
    Vec_IntFreeP(&p->vLevels);
  }
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fCut != 0)) {
    uVar8 = Gia_ManCrossCut(p,0);
    Gia_ManCrossCut(p,1);
    Abc_Print(1,"  cut = %d(%d)",(ulong)uVar8);
  }
  dVar12 = Gia_ManMemory(p);
  Abc_Print(1,"  mem =%5.2f MB",dVar12 / 1048576.0);
  iVar2 = Gia_ManHasChoices(p);
  if (iVar2 != 0) {
    uVar8 = Gia_ManChoiceNum(p);
    Abc_Print(1,"  ch =%5d",(ulong)uVar8);
  }
  if (p->pManTime != (void *)0x0) {
    uVar8 = Gia_ManNonRegBoxNum(p);
    Abc_Print(1,"  box = %d",(ulong)uVar8);
  }
  if (p->pManTime != (void *)0x0) {
    uVar8 = Gia_ManBlackBoxNum(p);
    Abc_Print(1,"  bb = %d",(ulong)uVar8);
  }
  iVar2 = Gia_ManBufNum(p);
  if (iVar2 != 0) {
    uVar8 = Gia_ManBufNum(p);
    Abc_Print(1,"  buf = %d",(ulong)uVar8);
  }
  iVar2 = Gia_ManXorNum(p);
  if ((iVar2 != 0) && (p->pMuxes == (uint *)0x0)) {
    uVar8 = Gia_ManXorNum(p);
    Abc_Print(1,"  xor = %d",(ulong)uVar8);
  }
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fMuxXor != 0)) {
    printf("\nXOR/MUX ");
    Gia_ManPrintMuxStats(p);
  }
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fSwitch != 0)) {
    fVar11 = Gia_ManComputeSwitching(p,0x30,0x10,0);
    Abc_Print(1,"  power =%8.1f",(double)fVar11);
    iVar2 = Gia_ManPrintStats::nPiPo;
    if (0.0 < Gia_ManPrintStats::PrevSwiTotal) {
      iVar3 = Gia_ManCiNum(p);
      iVar4 = Gia_ManCoNum(p);
      if (iVar2 == iVar3 + iVar4) {
        Abc_Print(1," %6.2f %%",
                  ((double)(Gia_ManPrintStats::PrevSwiTotal - fVar11) * 100.0) /
                  (double)Gia_ManPrintStats::PrevSwiTotal);
        goto LAB_0022201a;
      }
    }
    iVar2 = Gia_ManPrintStats::nPiPo;
    if ((Gia_ManPrintStats::PrevSwiTotal != 0.0) || (NAN(Gia_ManPrintStats::PrevSwiTotal))) {
      iVar3 = Gia_ManCiNum(p);
      iVar4 = Gia_ManCoNum(p);
      if (iVar2 == iVar3 + iVar4) goto LAB_0022201a;
    }
    Gia_ManPrintStats::PrevSwiTotal = fVar11;
    iVar2 = Gia_ManCiNum(p);
    iVar3 = Gia_ManCoNum(p);
    Gia_ManPrintStats::nPiPo = iVar2 + iVar3;
  }
LAB_0022201a:
  Abc_Print(1,"\n");
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
    Gia_ManEquivPrintClasses(p,0,0.0);
  }
  iVar2 = Gia_ManHasMapping(p);
  if ((iVar2 == 0) || ((pPars != (Gps_Par_t *)0x0 && (pPars->fSkipMap != 0)))) {
    if ((pPars != (Gps_Par_t *)0x0) && (pPars->pDumpFile != (char *)0x0)) {
      Gia_ManLogAigStats(p,pPars->pDumpFile);
    }
  }
  else {
    if (pPars == (Gps_Par_t *)0x0) {
      local_70 = (char *)0x0;
    }
    else {
      local_70 = pPars->pDumpFile;
    }
    Gia_ManPrintMappingStats(p,local_70);
  }
  if ((((pPars != (Gps_Par_t *)0x0) && (pPars->fNpn != 0)) &&
      (iVar2 = Gia_ManHasMapping(p), iVar2 != 0)) && (iVar2 = Gia_ManLutSizeMax(p), iVar2 < 5)) {
    Gia_ManPrintNpnClasses(p);
  }
  if (p->vPacking != (Vec_Int_t *)0x0) {
    Gia_ManPrintPackingStats(p);
  }
  if (p->vEdge1 != (Vec_Int_t *)0x0) {
    Gia_ManPrintEdges(p);
  }
  if (((pPars != (Gps_Par_t *)0x0) && (pPars->fLutProf != 0)) &&
     (iVar2 = Gia_ManHasMapping(p), iVar2 != 0)) {
    Gia_ManPrintLutStats(p);
  }
  if (p->pPlacement != (Gia_Plc_t *)0x0) {
    Gia_ManPrintPlacement(p);
  }
  Gia_ManPrintFlopClasses(p);
  Gia_ManPrintGateClasses(p);
  Gia_ManPrintObjClasses(p);
  if (p->vInitClasses != (Vec_Int_t *)0x0) {
    Gia_ManPrintInitClasses(p->vInitClasses);
  }
  Gia_ManCheckIntegrityWithBoxes(p);
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fTents != 0)) {
    Gia_ManPrintTents(p);
  }
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fSlacks != 0)) {
    Gia_ManDfsSlacksPrint(p);
  }
  return;
}

Assistant:

void Gia_ManPrintStats( Gia_Man_t * p, Gps_Par_t * pPars )
{
    extern float Gia_ManLevelAve( Gia_Man_t * p );
    int fHaveLevels = p->vLevels != NULL;
    if ( pPars && pPars->fMiter )
    {
        Gia_ManPrintStatsMiter( p, 0 );
        return;
    }
    if ( pPars && pPars->fNoColor )
    {
        if ( p->pName )
            Abc_Print( 1, "%-8s : ", p->pName );
    }
    else
    {
#ifdef WIN32
    SetConsoleTextAttribute( GetStdHandle(STD_OUTPUT_HANDLE), 15 ); // bright
    if ( p->pName )
        Abc_Print( 1, "%-8s : ", p->pName );
    SetConsoleTextAttribute( GetStdHandle(STD_OUTPUT_HANDLE), 7 );  // normal
#else
    if ( p->pName )
        Abc_Print( 1, "%s%-8s%s : ", "\033[1;37m", p->pName, "\033[0m" );  // bright
#endif
    }
    Abc_Print( 1, "i/o =%7d/%7d", 
        Gia_ManPiNum(p) - Gia_ManBoxCiNum(p) - Gia_ManRegBoxNum(p), 
        Gia_ManPoNum(p) - Gia_ManBoxCoNum(p) - Gia_ManRegBoxNum(p) );
    if ( Gia_ManConstrNum(p) )
        Abc_Print( 1, "(c=%d)", Gia_ManConstrNum(p) );
    if ( Gia_ManRegNum(p) )
        Abc_Print( 1, "  ff =%7d", Gia_ManRegNum(p) );
    if ( Gia_ManRegBoxNum(p) )
        Abc_Print( 1, "  boxff =%d(%d)", Gia_ManRegBoxNum(p), Gia_ManClockDomainNum(p) );
    if ( pPars && pPars->fNoColor )
    {
        Abc_Print( 1, "  %s =%8d", p->pMuxes? "nod" : "and", Gia_ManAndNum(p) );
        Abc_Print( 1, "  lev =%5d", Gia_ManLevelNum(p) ); 
        Abc_Print( 1, " (%.2f)", Gia_ManLevelAve(p) ); 
    }
    else
    {
#ifdef WIN32
    {
    HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
    SetConsoleTextAttribute( hConsole, 11 ); // blue
    Abc_Print( 1, "  %s =%8d", p->pMuxes? "nod" : "and", Gia_ManAndNum(p) );
    SetConsoleTextAttribute( hConsole, 13 ); // magenta
    Abc_Print( 1, "  lev =%5d", Gia_ManLevelNum(p) ); 
    Abc_Print( 1, " (%.2f)", Gia_ManLevelAve(p) ); 
    SetConsoleTextAttribute( hConsole, 7 ); // normal
    }
#else
    Abc_Print( 1, "  %s%s =%8d%s",  "\033[1;36m", p->pMuxes? "nod" : "and", Gia_ManAndNum(p), "\033[0m" ); // blue
    Abc_Print( 1, "  %slev =%5d%s", "\033[1;35m", Gia_ManLevelNum(p), "\033[0m" ); // magenta
    Abc_Print( 1, " %s(%.2f)%s",    "\033[1;35m", Gia_ManLevelAve(p), "\033[0m" ); 
#endif
    }
    if ( !fHaveLevels ) 
        Vec_IntFreeP( &p->vLevels );
    if ( pPars && pPars->fCut )
        Abc_Print( 1, "  cut = %d(%d)", Gia_ManCrossCut(p, 0), Gia_ManCrossCut(p, 1) );
    Abc_Print( 1, "  mem =%5.2f MB", Gia_ManMemory(p)/(1<<20) );
    if ( Gia_ManHasChoices(p) )
        Abc_Print( 1, "  ch =%5d", Gia_ManChoiceNum(p) );
    if ( p->pManTime )
        Abc_Print( 1, "  box = %d", Gia_ManNonRegBoxNum(p) );
    if ( p->pManTime )
        Abc_Print( 1, "  bb = %d", Gia_ManBlackBoxNum(p) );
    if ( Gia_ManBufNum(p) )
        Abc_Print( 1, "  buf = %d", Gia_ManBufNum(p) );
    if ( Gia_ManXorNum(p) && p->pMuxes == NULL )
        Abc_Print( 1, "  xor = %d", Gia_ManXorNum(p) );
    if ( pPars && pPars->fMuxXor )
        printf( "\nXOR/MUX " ), Gia_ManPrintMuxStats( p );
    if ( pPars && pPars->fSwitch )
    {
        static int nPiPo = 0;
        static float PrevSwiTotal = 0;
        float SwiTotal = Gia_ManComputeSwitching( p, 48, 16, 0 );
        Abc_Print( 1, "  power =%8.1f", SwiTotal );
        if ( PrevSwiTotal > 0 && nPiPo == Gia_ManCiNum(p) + Gia_ManCoNum(p) )
            Abc_Print( 1, " %6.2f %%", 100.0*(PrevSwiTotal-SwiTotal)/PrevSwiTotal );
        else if ( PrevSwiTotal == 0 || nPiPo != Gia_ManCiNum(p) + Gia_ManCoNum(p) )
            PrevSwiTotal = SwiTotal, nPiPo = Gia_ManCiNum(p) + Gia_ManCoNum(p);
    }
//    Abc_Print( 1, "obj =%5d  ", Gia_ManObjNum(p) );
    Abc_Print( 1, "\n" );

//    Gia_ManSatExperiment( p );
    if ( p->pReprs && p->pNexts )
        Gia_ManEquivPrintClasses( p, 0, 0.0 );
    if ( Gia_ManHasMapping(p) && (pPars == NULL || !pPars->fSkipMap) )
        Gia_ManPrintMappingStats( p, pPars ? pPars->pDumpFile : NULL );
    else if ( pPars && pPars->pDumpFile )
        Gia_ManLogAigStats( p, pPars->pDumpFile );
    if ( pPars && pPars->fNpn && Gia_ManHasMapping(p) && Gia_ManLutSizeMax(p) <= 4 )
        Gia_ManPrintNpnClasses( p );
    if ( p->vPacking )
        Gia_ManPrintPackingStats( p );
    if ( p->vEdge1 )
        Gia_ManPrintEdges( p );
    if ( pPars && pPars->fLutProf && Gia_ManHasMapping(p) )
        Gia_ManPrintLutStats( p );
    if ( p->pPlacement )
        Gia_ManPrintPlacement( p );
//    if ( p->pManTime )
//        Tim_ManPrintStats( (Tim_Man_t *)p->pManTime, p->nAnd2Delay );
    Gia_ManPrintFlopClasses( p );
    Gia_ManPrintGateClasses( p );
    Gia_ManPrintObjClasses( p );
//    if ( p->vRegClasses )
//    {
//        printf( "The design has %d flops with the following class info: ", Vec_IntSize(p->vRegClasses) );
//        Vec_IntPrint( p->vRegClasses );
//    }
    if ( p->vInitClasses )
        Gia_ManPrintInitClasses( p->vInitClasses );
    // check integrity of boxes
    Gia_ManCheckIntegrityWithBoxes( p );
/*
    if ( Gia_ManRegBoxNum(p) )
    {
        int i, Limit = Vec_IntFindMax(p->vRegClasses);
        for ( i = 1; i <= Limit; i++ )
            printf( "%d ", Vec_IntCountEntry(p->vRegClasses, i) );
        printf( "\n" );
    }
*/
    if ( pPars && pPars->fTents )
    {
/*
        int k, Entry, Prev = 1;
        Vec_Int_t * vLimit = Vec_IntAlloc( 1000 );
        Gia_Man_t * pNew = Gia_ManUnrollDup( p, vLimit );
        Abc_Print( 1, "Tents:  " );
        Vec_IntForEachEntryStart( vLimit, Entry, k, 1 )
            Abc_Print( 1, "%d=%d  ", k, Entry-Prev ), Prev = Entry;
        Abc_Print( 1, " Unused=%d.", Gia_ManObjNum(p) - Gia_ManObjNum(pNew) );
        Abc_Print( 1, "\n" );
        Vec_IntFree( vLimit );
        Gia_ManStop( pNew );
*/
        Gia_ManPrintTents( p );
    }
    if ( pPars && pPars->fSlacks )
        Gia_ManDfsSlacksPrint( p );
}